

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O0

void tif_15uto32s(OPJ_BYTE *pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  OPJ_INT32 *pOVar14;
  OPJ_INT32 OVar15;
  ulong uVar16;
  byte bVar17;
  byte *pbVar18;
  uint local_a4;
  int local_a0;
  uint dst_6;
  int needed_6;
  uint dst_5;
  int needed_5;
  uint dst_4;
  int needed_4;
  uint dst_3;
  int needed_3;
  uint dst_2;
  int needed_2;
  uint dst_1;
  int needed_1;
  uint dst;
  int needed;
  int available;
  uint val;
  OPJ_UINT32 val14;
  OPJ_UINT32 val13;
  OPJ_UINT32 val12;
  OPJ_UINT32 val11;
  OPJ_UINT32 val10;
  OPJ_UINT32 val9;
  OPJ_UINT32 val8;
  OPJ_UINT32 val7;
  OPJ_UINT32 val6;
  OPJ_UINT32 val5;
  OPJ_UINT32 val4;
  OPJ_UINT32 val3;
  OPJ_UINT32 val2;
  OPJ_UINT32 val1;
  OPJ_UINT32 val0;
  OPJ_SIZE_T i;
  OPJ_SIZE_T length_local;
  OPJ_INT32 *pDst_local;
  OPJ_BYTE *pSrc_local;
  
  pDst_local = (OPJ_INT32 *)pSrc;
  for (_val1 = 0; _val1 < (length & 0xfffffffffffffff8); _val1 = _val1 + 8) {
    OVar15 = *pDst_local;
    bVar17 = *(byte *)((long)pDst_local + 1);
    bVar1 = *(byte *)((long)pDst_local + 2);
    bVar2 = *(byte *)((long)pDst_local + 3);
    bVar3 = *(byte *)(pDst_local + 1);
    bVar4 = *(byte *)((long)pDst_local + 5);
    bVar5 = *(byte *)((long)pDst_local + 6);
    bVar6 = *(byte *)((long)pDst_local + 7);
    bVar7 = *(byte *)(pDst_local + 2);
    bVar8 = *(byte *)((long)pDst_local + 9);
    bVar9 = *(byte *)((long)pDst_local + 10);
    bVar10 = *(byte *)((long)pDst_local + 0xb);
    bVar11 = *(byte *)(pDst_local + 3);
    pbVar18 = (byte *)((long)pDst_local + 0xe);
    bVar12 = *(byte *)((long)pDst_local + 0xd);
    pDst_local = (OPJ_INT32 *)((long)pDst_local + 0xf);
    bVar13 = *pbVar18;
    pDst[_val1] = (uint)(byte)OVar15 << 7 | (uint)(bVar17 >> 1);
    pDst[_val1 + 1] = (bVar17 & 1) << 0xe | (uint)bVar1 << 6 | (uint)(bVar2 >> 2);
    pDst[_val1 + 2] = (bVar2 & 3) << 0xd | (uint)bVar3 << 5 | (uint)(bVar4 >> 3);
    pDst[_val1 + 3] = (bVar4 & 7) << 0xc | (uint)bVar5 << 4 | (uint)(bVar6 >> 4);
    pDst[_val1 + 4] = (bVar6 & 0xf) << 0xb | (uint)bVar7 << 3 | (uint)(bVar8 >> 5);
    pDst[_val1 + 5] = (bVar8 & 0x1f) << 10 | (uint)bVar9 << 2 | (uint)(bVar10 >> 6);
    pDst[_val1 + 6] = (bVar10 & 0x3f) << 9 | (uint)bVar11 << 1 | (uint)(bVar12 >> 7);
    pDst[_val1 + 7] = (bVar12 & 0x7f) << 8 | (uint)bVar13;
  }
  if ((length & 7) != 0) {
    uVar16 = length & 7;
    needed_1 = 0xf;
    dst_1 = 0;
    bVar17 = (byte)*pDst_local;
    pOVar14 = pDst_local;
    while( true ) {
      pDst_local = (OPJ_INT32 *)((long)pOVar14 + 1);
      needed = (int)bVar17;
      if (needed_1 < 9) break;
      needed_1 = needed_1 + -8;
      dst_1 = (needed | dst_1) << ((byte)needed_1 & 0x1f);
      bVar17 = *(byte *)pDst_local;
      pOVar14 = pDst_local;
    }
    dst = 8 - needed_1;
    pDst[_val1] = (uint)(bVar17 >> (8 - (byte)needed_1 & 0x1f)) &
                  (1 << ((byte)needed_1 & 0x1f)) - 1U | dst_1;
    if (1 < uVar16) {
      needed_2 = 0xf;
      dst_2 = 0;
      if (dst == 0) {
        needed = (int)*(byte *)pDst_local;
        dst = 8;
        pDst_local = (OPJ_INT32 *)((long)pOVar14 + 2);
      }
      while (bVar17 = (byte)dst, (int)dst < needed_2) {
        needed_2 = needed_2 - dst;
        dst_2 = (needed & (1 << (bVar17 & 0x1f)) - 1U | dst_2) << ((byte)needed_2 & 0x1f);
        needed = (int)(byte)*pDst_local;
        pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
        dst = 8;
      }
      dst = dst - needed_2;
      pDst[_val1 + 1] =
           (uint)needed >> (bVar17 - (byte)needed_2 & 0x1f) & (1 << ((byte)needed_2 & 0x1f)) - 1U |
           dst_2;
      if (2 < uVar16) {
        needed_3 = 0xf;
        dst_3 = 0;
        if (dst == 0) {
          needed = (int)(byte)*pDst_local;
          dst = 8;
          pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
        }
        while (bVar17 = (byte)dst, (int)dst < needed_3) {
          needed_3 = needed_3 - dst;
          dst_3 = (needed & (1 << (bVar17 & 0x1f)) - 1U | dst_3) << ((byte)needed_3 & 0x1f);
          needed = (int)(byte)*pDst_local;
          pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
          dst = 8;
        }
        dst = dst - needed_3;
        pDst[_val1 + 2] =
             (uint)needed >> (bVar17 - (byte)needed_3 & 0x1f) & (1 << ((byte)needed_3 & 0x1f)) - 1U
             | dst_3;
        if (3 < uVar16) {
          needed_4 = 0xf;
          dst_4 = 0;
          if (dst == 0) {
            needed = (int)(byte)*pDst_local;
            dst = 8;
            pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
          }
          while (bVar17 = (byte)dst, (int)dst < needed_4) {
            needed_4 = needed_4 - dst;
            dst_4 = (needed & (1 << (bVar17 & 0x1f)) - 1U | dst_4) << ((byte)needed_4 & 0x1f);
            needed = (int)(byte)*pDst_local;
            pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
            dst = 8;
          }
          dst = dst - needed_4;
          pDst[_val1 + 3] =
               (uint)needed >> (bVar17 - (byte)needed_4 & 0x1f) &
               (1 << ((byte)needed_4 & 0x1f)) - 1U | dst_4;
          if (4 < uVar16) {
            needed_5 = 0xf;
            dst_5 = 0;
            if (dst == 0) {
              needed = (int)(byte)*pDst_local;
              dst = 8;
              pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
            }
            while (bVar17 = (byte)dst, (int)dst < needed_5) {
              needed_5 = needed_5 - dst;
              dst_5 = (needed & (1 << (bVar17 & 0x1f)) - 1U | dst_5) << ((byte)needed_5 & 0x1f);
              needed = (int)(byte)*pDst_local;
              pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
              dst = 8;
            }
            dst = dst - needed_5;
            pDst[_val1 + 4] =
                 (uint)needed >> (bVar17 - (byte)needed_5 & 0x1f) &
                 (1 << ((byte)needed_5 & 0x1f)) - 1U | dst_5;
            if (5 < uVar16) {
              needed_6 = 0xf;
              dst_6 = 0;
              if (dst == 0) {
                needed = (int)(byte)*pDst_local;
                dst = 8;
                pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
              }
              while (bVar17 = (byte)dst, (int)dst < needed_6) {
                needed_6 = needed_6 - dst;
                dst_6 = (needed & (1 << (bVar17 & 0x1f)) - 1U | dst_6) << ((byte)needed_6 & 0x1f);
                needed = (int)(byte)*pDst_local;
                pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
                dst = 8;
              }
              dst = dst - needed_6;
              pDst[_val1 + 5] =
                   (uint)needed >> (bVar17 - (byte)needed_6 & 0x1f) &
                   (1 << ((byte)needed_6 & 0x1f)) - 1U | dst_6;
              if (6 < uVar16) {
                local_a0 = 0xf;
                local_a4 = 0;
                if (dst == 0) {
                  needed = (int)(byte)*pDst_local;
                  dst = 8;
                  pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
                }
                while ((int)dst < local_a0) {
                  local_a0 = local_a0 - dst;
                  local_a4 = (needed & (1 << ((byte)dst & 0x1f)) - 1U | local_a4) <<
                             ((byte)local_a0 & 0x1f);
                  needed = (int)(byte)*pDst_local;
                  pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
                  dst = 8;
                }
                pDst[_val1 + 6] =
                     (uint)needed >> ((byte)dst - (byte)local_a0 & 0x1f) &
                     (1 << ((byte)local_a0 & 0x1f)) - 1U | local_a4;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void tif_15uto32s(const OPJ_BYTE* pSrc, OPJ_INT32* pDst, OPJ_SIZE_T length)
{
	OPJ_SIZE_T i;
	for (i = 0; i < (length & ~(OPJ_SIZE_T)7U); i+=8U) {
		OPJ_UINT32 val0 = *pSrc++;
		OPJ_UINT32 val1 = *pSrc++;
		OPJ_UINT32 val2 = *pSrc++;
		OPJ_UINT32 val3 = *pSrc++;
		OPJ_UINT32 val4 = *pSrc++;
		OPJ_UINT32 val5 = *pSrc++;
		OPJ_UINT32 val6 = *pSrc++;
		OPJ_UINT32 val7 = *pSrc++;
		OPJ_UINT32 val8 = *pSrc++;
		OPJ_UINT32 val9 = *pSrc++;
		OPJ_UINT32 val10 = *pSrc++;
		OPJ_UINT32 val11 = *pSrc++;
		OPJ_UINT32 val12 = *pSrc++;
		OPJ_UINT32 val13 = *pSrc++;
		OPJ_UINT32 val14 = *pSrc++;
		
		pDst[i+0] = (OPJ_INT32)((val0 << 7) | (val1 >> 1));
		pDst[i+1] = (OPJ_INT32)(((val1 & 0x1U) << 14) | (val2 << 6) | (val3 >> 2));
		pDst[i+2] = (OPJ_INT32)(((val3 & 0x3U) << 13) | (val4 << 5) | (val5 >> 3));
		pDst[i+3] = (OPJ_INT32)(((val5 & 0x7U) << 12) | (val6 << 4) | (val7 >> 4));
		pDst[i+4] = (OPJ_INT32)(((val7 & 0xFU) << 11) | (val8 << 3) | (val9 >> 5));
		pDst[i+5] = (OPJ_INT32)(((val9 & 0x1FU) << 10) | (val10 << 2) | (val11 >> 6));
		pDst[i+6] = (OPJ_INT32)(((val11 & 0x3FU) << 9) | (val12 << 1) | (val13 >> 7));
		pDst[i+7] = (OPJ_INT32)(((val13 & 0x7FU) << 8) | (val14));
		
	}
	if (length & 7U) {
		unsigned int val;
		int available = 0;
		
		length = length & 7U;
		
		GETBITS(pDst[i+0], 15)

		if (length > 1U) {
			GETBITS(pDst[i+1], 15)
			if (length > 2U) {
				GETBITS(pDst[i+2], 15)
				if (length > 3U) {
					GETBITS(pDst[i+3], 15)
					if (length > 4U) {
						GETBITS(pDst[i+4], 15)
						if (length > 5U) {
							GETBITS(pDst[i+5], 15)
							if (length > 6U) {
								GETBITS(pDst[i+6], 15)
							}
						}
					}
				}
			}
		}
	}
}